

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::reset(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
        *this)

{
  PipeType PVar1;
  size_t sVar2;
  reference pvVar3;
  Line *pLVar4;
  reference pvVar5;
  pointer pPVar6;
  long in_RDI;
  size_t l_2;
  size_t f_1;
  size_t f;
  size_t l_1;
  size_t l;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  size_t in_stack_fffffffffffffec0;
  size_type __n;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *in_stack_fffffffffffffec8;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *in_stack_fffffffffffffed0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  
  *(undefined8 *)(in_RDI + 0x18) = 0;
  for (local_90 = 0;
      sVar2 = num_lines((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *)0x144cb0), local_90 < sVar2; local_90 = local_90 + 1) {
    pvVar3 = std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
                       ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)(in_RDI + 0x50),
                        local_90);
    pvVar3->_pipe = 0;
    pvVar3 = std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
                       ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)(in_RDI + 0x50),
                        local_90);
    pvVar3->_line = local_90;
    pvVar3 = std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
                       ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)(in_RDI + 0x50),
                        local_90);
    pvVar3->_num_deferrals = 0;
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
              ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)(in_RDI + 0x50),local_90);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *)0x144d5f);
  }
  pLVar4 = _line(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (pLVar4->join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  for (local_98 = 1;
      sVar2 = num_lines((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *)0x144e57), local_98 < sVar2; local_98 = local_98 + 1) {
    for (local_a0 = 1;
        sVar2 = num_pipes((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                           *)0x144e8e), local_a0 < sVar2; local_a0 = local_a0 + 1) {
      pLVar4 = _line(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0);
      pvVar5 = std::
               vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
               ::operator[]((vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                             *)(in_RDI + 0x20),local_a0);
      pPVar6 = __gnu_cxx::
               __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
               ::operator->(pvVar5);
      PVar1 = Pipe<std::function<void_(tf::Pipeflow_&)>_>::type(pPVar6);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (pLVar4->join_counter).super___atomic_base<unsigned_long>._M_i = (long)(int)PVar1;
    }
  }
  for (local_a8 = 1;
      sVar2 = num_pipes((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *)0x144fee), local_a8 < sVar2; local_a8 = local_a8 + 1) {
    pLVar4 = _line(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec0);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pLVar4->join_counter).super___atomic_base<unsigned_long>._M_i = 1;
  }
  for (local_b0 = 1;
      sVar2 = num_lines((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *)0x1450fe), local_b0 < sVar2; local_b0 = local_b0 + 1) {
    __n = 0;
    in_stack_fffffffffffffec8 =
         (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
          *)_line(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,0);
    pvVar5 = std::
             vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
             ::operator[]((vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                           *)(in_RDI + 0x20),__n);
    pPVar6 = __gnu_cxx::
             __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
             ::operator->(pvVar5);
    PVar1 = Pipe<std::function<void_(tf::Pipeflow_&)>_>::type(pPVar6);
    in_stack_fffffffffffffed0 = in_stack_fffffffffffffec8;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (in_stack_fffffffffffffed0->_graph).
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)(int)PVar1 - 1);
  }
  std::
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *)0x145232);
  std::
  unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
  ::clear((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
           *)0x145246);
  return;
}

Assistant:

void ScalablePipeline<P>::reset() {

  _num_tokens = 0;

  for(size_t l = 0; l<num_lines(); l++) {
    _pipeflows[l]._pipe = 0;
    _pipeflows[l]._line = l;
    _pipeflows[l]._num_deferrals = 0;
    _pipeflows[l]._dependents.clear();
  }

  _line(0, 0).join_counter.store(0, std::memory_order_relaxed);

  for(size_t l=1; l<num_lines(); l++) {
    for(size_t f=1; f<num_pipes(); f++) {
      _line(l, f).join_counter.store(
        static_cast<size_t>(_pipes[f]->type()), std::memory_order_relaxed
      );
    }
  }

  for(size_t f=1; f<num_pipes(); f++) {
    _line(0, f).join_counter.store(1, std::memory_order_relaxed);
  }

  for(size_t l=1; l<num_lines(); l++) {
    _line(l, 0).join_counter.store(
      static_cast<size_t>(_pipes[0]->type()) - 1, std::memory_order_relaxed
    );
  }
  
  assert(_ready_tokens.empty() == true);
  _token_dependencies.clear();
  _deferred_tokens.clear();
}